

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals Omega_h::repeat_matrix<2>(LO n,Tensor<2> m)

{
  undefined8 uVar1;
  Vector<4> v_00;
  long lVar2;
  undefined4 in_register_0000003c;
  Reals RVar3;
  Reals RVar4;
  Vector<4> v;
  double local_48 [8];
  
  RVar4.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar4.write_.shared_alloc_.alloc._0_4_ = n;
  local_48[2] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  local_48[3] = m.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1];
  local_48[0] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_48[1] = m.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    uVar1 = *(undefined8 *)((long)local_48 + lVar2 + 0x10);
    *(undefined8 *)((long)local_48 + lVar2 * 2 + 0x20) = *(undefined8 *)((long)local_48 + lVar2);
    *(undefined8 *)((long)local_48 + lVar2 * 2 + 0x28) = uVar1;
  }
  v_00.super_Few<double,_4>.array_[1] = local_48[5];
  v_00.super_Few<double,_4>.array_[0] = local_48[4];
  v_00.super_Few<double,_4>.array_[2] = local_48[6];
  v_00.super_Few<double,_4>.array_[3] = local_48[7];
  RVar3 = repeat_vector<4>(n,v_00);
  RVar4.write_.shared_alloc_.direct_ptr = RVar3.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}